

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Resize(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
         *this,int newSize)

{
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Memory *this_00;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar6;
  uint i;
  ulong uVar7;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar8;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (this->disableResize == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SimpleHashTable.h"
                       ,0x172,"(!this->disableResize)","!this->disableResize");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  local_58 = (undefined1  [8])&SimpleHashEntry<void*,Memory::Recycler::PinRecord>*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_26dcd30;
  data.filename._0_4_ = 0x173;
  data.plusSize = (long)newSize;
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_58);
  ppSVar6 = Memory::
            AllocateArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*,false>
                      (this_00,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,(long)newSize);
  for (uVar7 = 0; uVar7 < this->size; uVar7 = uVar7 + 1) {
    pSVar8 = this->table[uVar7];
    while (pSVar8 != (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)0x0) {
      uVar4 = HashKeyToBucket(this,pSVar8->key,newSize);
      pSVar1 = pSVar8->next;
      pSVar8->next = ppSVar6[(int)uVar4];
      ppSVar6[(int)uVar4] = pSVar8;
      pSVar8 = pSVar1;
    }
  }
  Memory::DeleteArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*>
            (this->allocator,(ulong)this->size,this->table);
  this->size = newSize;
  this->table = ppSVar6;
  if (this->stats != (DictionaryStats *)0x0) {
    uVar4 = 0;
    for (uVar7 = 0; (uint)newSize != uVar7; uVar7 = uVar7 + 1) {
      uVar4 = uVar4 + (ppSVar6[uVar7] == (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)0x0
                      );
    }
    DictionaryStats::Resize(this->stats,newSize,uVar4);
  }
  return;
}

Assistant:

void Resize(int newSize)
    {
        Assert(!this->disableResize);
        EntryType** newTable = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, newSize);

        for (uint i=0; i < size; i++)
        {
            EntryType* current = table[i];
            while (current != nullptr)
            {
                int targetBucket = HashKeyToBucket(current->key, newSize);
                EntryType* next = current->next; // Cache the next pointer
                current->next = newTable[targetBucket];
                newTable[targetBucket] = current;
                current = next;
            }
        }

        AllocatorDeleteArray(TAllocator, allocator, this->size, this->table);
        this->size = newSize;
        this->table = newTable;
#if PROFILE_DICTIONARY
        if (stats)
        {
            uint emptyBuckets  = 0 ;
            for (uint i=0; i < size; i++)
            {
                if(table[i] == nullptr)
                {
                    emptyBuckets++;
                }
            }
            stats->Resize(newSize, emptyBuckets);
        }
#endif

    }